

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_array_scan_state.cpp
# Opt level: O2

void __thiscall
duckdb::ArrowArrayScanState::AddDictionary
          (ArrowArrayScanState *this,
          unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *dictionary_p,
          ArrowArray *arrow_dict)

{
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var1;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var2;
  pointer pVVar3;
  VectorBuffer *pVVar4;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> local_30;
  __shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  ::std::__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>::operator=
            ((__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)
             &this->dictionary,
             (__uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> *)dictionary_p);
  (this->arrow_dictionary).ptr = arrow_dict;
  pVVar3 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                     (&this->dictionary);
  ::std::__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_28,
             (__shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2> *)&pVVar3->buffer);
  pVVar4 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                     ((shared_ptr<duckdb::VectorBuffer,_true> *)&local_28);
  make_uniq<duckdb::ArrowAuxiliaryData,duckdb::shared_ptr<duckdb::ArrowArrayWrapper,true>&>
            ((duckdb *)&local_30,&this->owned_data);
  _Var2._M_head_impl = local_30._M_head_impl;
  local_30._M_head_impl = (VectorAuxiliaryData *)0x0;
  _Var1._M_head_impl =
       (pVVar4->aux_data).
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  (pVVar4->aux_data).
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
    if (local_30._M_head_impl != (VectorAuxiliaryData *)0x0) {
      (**(code **)(*(long *)local_30._M_head_impl + 8))();
    }
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  return;
}

Assistant:

void ArrowArrayScanState::AddDictionary(unique_ptr<Vector> dictionary_p, ArrowArray *arrow_dict) {
	dictionary = std::move(dictionary_p);
	D_ASSERT(owned_data);
	D_ASSERT(arrow_dict);
	arrow_dictionary = arrow_dict;
	// Make sure the data referenced by the dictionary stays alive
	dictionary->GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(owned_data));
}